

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_algebraic.h
# Opt level: O0

void mp::WriteJSON<mp::LinTerms,mp::AlgConRhs<0>>
               (JSONW *jw,AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_> *algc)

{
  LinTerms *this;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_> *in_RSI;
  char *in_RDI;
  AlgConRhs<0> acrhs;
  LinTerms *in_stack_00000018;
  JSONW *in_stack_00000020;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff90;
  JSONW *in_stack_ffffffffffffffa0;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *in_stack_ffffffffffffffb8;
  string_view in_stack_ffffffffffffffc0;
  
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffff90,in_RDI);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffc0);
  this = AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>::GetBody(in_RSI);
  WriteJSON<mp::MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>,mp::LinTerms>
            (in_stack_00000020,in_stack_00000018);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x1a25df);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)this,in_RDI);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffc0);
  acrhs = AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>::GetRhsOrRange(in_RSI);
  WriteJSON<0>(in_stack_ffffffffffffffa0,(AlgConRhs<0> *)acrhs.rhs_);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x1a2642);
  return;
}

Assistant:

inline void WriteJSON(JSONW jw,
                      const AlgebraicConstraint<Body, RhsOrRange>& algc) {
  WriteJSON(jw["body"], algc.GetBody());
  WriteJSON(jw["rhs_or_range"], algc.GetRhsOrRange());
}